

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::GaussianPuffRecord
          (GaussianPuffRecord *this,KUINT8 Index,WorldCoordinates *PuffLocation,
          WorldCoordinates *OriginationLocation,Vector *Sigma,Vector *DDT,EulerAngles *Orientation,
          Vector *Velocity,Vector *AngularVelocity,KFLOAT32 CentroidHeight)

{
  KFLOAT32 CentroidHeight_local;
  Vector *DDT_local;
  Vector *Sigma_local;
  WorldCoordinates *OriginationLocation_local;
  WorldCoordinates *PuffLocation_local;
  KUINT8 Index_local;
  GaussianPuffRecord *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GaussianPuffRecord_0032dfc8;
  WorldCoordinates::WorldCoordinates(&this->m_PuffLocation,PuffLocation);
  WorldCoordinates::WorldCoordinates(&this->m_OrigLocation,OriginationLocation);
  Vector::Vector(&this->m_Sigma,Sigma);
  Vector::Vector(&this->m_DDTSigma,DDT);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  Vector::Vector(&this->m_Velocity,Velocity);
  Vector::Vector(&this->m_AngularVelocity,AngularVelocity);
  this->m_f32CentHeight = CentroidHeight;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x70000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x380;
  return;
}

Assistant:

GaussianPuffRecord::GaussianPuffRecord( KUINT8 Index, const WorldCoordinates & PuffLocation, const WorldCoordinates & OriginationLocation,
                                        const Vector & Sigma, const Vector & DDT, const EulerAngles & Orientation, const Vector & Velocity,
                                        const Vector & AngularVelocity, KFLOAT32 CentroidHeight ) :
    m_PuffLocation( PuffLocation ),
    m_OrigLocation( OriginationLocation ),
    m_Sigma( Sigma ),
    m_DDTSigma( DDT ),
    m_Ori( Orientation ),
    m_Velocity( Velocity ),
    m_AngularVelocity( AngularVelocity ),
    m_f32CentHeight( CentroidHeight )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = GaussianPuffRecordType;
    m_ui16Length = ( GAUSSIAN_PUFF_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}